

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAgglomerateEl.h
# Opt level: O1

REAL __thiscall TPZAgglomerateElement::InnerRadius(TPZAgglomerateElement *this)

{
  long lVar1;
  TPZCompEl **ppTVar2;
  long *plVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  double local_40;
  
  lVar1 = (this->fIndexes).super_TPZManVector<long,_10>.super_TPZVec<long>.fNElements;
  if (lVar1 < 1) {
    local_40 = 0.0;
  }
  else {
    local_40 = 0.0;
    lVar4 = 0;
    do {
      ppTVar2 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          (&(this->fMotherMesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,
                           (this->fIndexes).super_TPZManVector<long,_10>.super_TPZVec<long>.fStore
                           [lVar4]);
      plVar3 = (long *)__dynamic_cast(*ppTVar2,&TPZCompEl::typeinfo,&TPZCompElDisc::typeinfo,0);
      dVar5 = (double)(**(code **)(*plVar3 + 0x2d0))(plVar3);
      dVar6 = (double)(**(code **)(*plVar3 + 0x60))(plVar3);
      local_40 = local_40 + dVar6 * dVar5;
      lVar4 = lVar4 + 1;
    } while (lVar1 != lVar4);
  }
  dVar5 = (double)(**(code **)(*(long *)&(this->super_TPZCompElDisc).super_TPZInterpolationSpace.
                                         super_TPZCompEl + 0x60))(this);
  return local_40 / dVar5;
}

Assistant:

REAL InnerRadius() override {
		int64_t nsubel = this->NIndexes();
		REAL value = 0.;
		TPZCompElDisc * disc;
		for (int64_t i = 0; i < nsubel; i++){
			disc = dynamic_cast<TPZCompElDisc *>(this->SubElement(i) );
#ifdef PZDEBUG
			if (!disc) {
				PZError << "TPZAgglomerateElement::InnerRadius FineElement must be a TPZCompElDisc" << std::endl;
				exit (-1);
			}
#endif
			value += disc->InnerRadius() * disc->VolumeOfEl();
		}
		value = value / this->VolumeOfEl();
		return value;  
	}